

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_3::accumulateShaderStorage
              (Shader *shader,Storage storage,_func_int_DataType *typeMap)

{
  int iVar1;
  VariableDeclarationStorageFilter local_28;
  InterfaceBlockStorageFilter local_24;
  _func_int_DataType *local_20;
  _func_int_DataType *typeMap_local;
  Shader *pSStack_10;
  Storage storage_local;
  Shader *shader_local;
  
  local_20 = typeMap;
  typeMap_local._4_4_ = storage;
  pSStack_10 = shader;
  InterfaceBlockStorageFilter::InterfaceBlockStorageFilter(&local_24,storage);
  VariableDeclarationStorageFilter::VariableDeclarationStorageFilter(&local_28,typeMap_local._4_4_);
  iVar1 = Functional::(anonymous_namespace)::
          accumulateShader<deqp::gles31::Functional::(anonymous_namespace)::InterfaceBlockStorageFilter,deqp::gles31::Functional::(anonymous_namespace)::VariableDeclarationStorageFilter,int(*)(glu::DataType)>
                    (shader,&local_24,&local_28,&local_20);
  return iVar1;
}

Assistant:

static int accumulateShaderStorage (const ProgramInterfaceDefinition::Shader* shader, glu::Storage storage, int (*typeMap)(glu::DataType))
{
	return accumulateShader(shader, InterfaceBlockStorageFilter(storage), VariableDeclarationStorageFilter(storage), typeMap);
}